

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_can_pbuf.c
# Opt level: O3

void csp_can_pbuf_cleanup(csp_can_interface_data_t *ifdata,int *task_woken)

{
  csp_packet_t *pcVar1;
  uint32_t uVar2;
  csp_packet_t *packet;
  csp_packet_s **ppcVar3;
  csp_packet_t *pcVar4;
  
  if (task_woken == (int *)0x0) {
    uVar2 = csp_get_ms();
  }
  else {
    uVar2 = csp_get_ms_isr();
  }
  if (ifdata->pbufs != (csp_packet_t *)0x0) {
    pcVar1 = ifdata->pbufs;
    pcVar4 = (csp_packet_t *)0x0;
    do {
      packet = pcVar1;
      if (1000 < uVar2 - (packet->field_0).field_1.last_used) {
        ppcVar3 = &pcVar4->next;
        if (pcVar4 == (csp_packet_t *)0x0) {
          ppcVar3 = &ifdata->pbufs;
        }
        *ppcVar3 = packet->next;
        if (task_woken == (int *)0x0) {
          csp_buffer_free(packet);
        }
        else {
          csp_buffer_free_isr(packet);
        }
      }
      pcVar1 = packet->next;
      pcVar4 = packet;
    } while (packet->next != (csp_packet_s *)0x0);
  }
  return;
}

Assistant:

void csp_can_pbuf_cleanup(csp_can_interface_data_t * ifdata, int * task_woken) {

	uint32_t now = (task_woken) ? csp_get_ms_isr() : csp_get_ms();

	csp_packet_t * packet = ifdata->pbufs;
	csp_packet_t * prev = NULL;

	while (packet) {

		/* Perform cleanup in used pbufs */
		if (now - packet->last_used > PBUF_TIMEOUT_MS) {

			/* Erase from list prev->next = next */
			if (prev) {
				prev->next = packet->next;
			} else {
				ifdata->pbufs = packet->next;
			}

			if (task_woken == NULL) {
				csp_buffer_free(packet);
			} else {
				csp_buffer_free_isr(packet);
			}

		}

		prev = packet;
		packet = packet->next;
	}

}